

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

Vec_Ptr_t * Hop_ManDfsNode(Hop_Man_t *p,Hop_Obj_t *pNode)

{
  Vec_Ptr_t *vNodes;
  void *pvVar1;
  int i;
  
  if (((ulong)pNode & 1) == 0) {
    vNodes = Vec_PtrAlloc(0x10);
    Hop_ManDfs_rec(pNode,vNodes);
    for (i = 0; i < vNodes->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(vNodes,i);
      *(byte *)((long)pvVar1 + 0x20) = *(byte *)((long)pvVar1 + 0x20) & 0xef;
    }
    return vNodes;
  }
  __assert_fail("!Hop_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopDfs.c"
                ,0x61,"Vec_Ptr_t *Hop_ManDfsNode(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Hop_ManDfsNode( Hop_Man_t * p, Hop_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i;
    assert( !Hop_IsComplement(pNode) );
    vNodes = Vec_PtrAlloc( 16 );
    Hop_ManDfs_rec( pNode, vNodes );
    Vec_PtrForEachEntry( Hop_Obj_t *, vNodes, pObj, i )
        Hop_ObjClearMarkA(pObj);
    return vNodes;
}